

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O0

void xercesc_4_0::XMLInitializer::terminateDatatypeValidatorFactory(void)

{
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *this;
  RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher> *this_00;
  void *in_RSI;
  
  this = DatatypeValidatorFactory::fBuiltInRegistry;
  if (DatatypeValidatorFactory::fBuiltInRegistry !=
      (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0) {
    RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::~RefHashTableOf
              (DatatypeValidatorFactory::fBuiltInRegistry);
    XMemory::operator_delete((XMemory *)this,in_RSI);
  }
  this_00 = DatatypeValidatorFactory::fCanRepRegistry;
  DatatypeValidatorFactory::fBuiltInRegistry =
       (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0;
  if (DatatypeValidatorFactory::fCanRepRegistry !=
      (RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher> *)0x0) {
    RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher>::~RefHashTableOf
              (DatatypeValidatorFactory::fCanRepRegistry);
    XMemory::operator_delete((XMemory *)this_00,in_RSI);
  }
  DatatypeValidatorFactory::fCanRepRegistry =
       (RefHashTableOf<xercesc_4_0::XMLCanRepGroup,_xercesc_4_0::PtrHasher> *)0x0;
  return;
}

Assistant:

void XMLInitializer::terminateDatatypeValidatorFactory()
{
    delete DatatypeValidatorFactory::fBuiltInRegistry;
    DatatypeValidatorFactory::fBuiltInRegistry = 0;

    delete DatatypeValidatorFactory::fCanRepRegistry;
    DatatypeValidatorFactory::fCanRepRegistry = 0;
}